

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_mdspan.h
# Opt level: O0

void __thiscall
Gudhi::
Simple_mdspan<int,_Gudhi::extents<int,_2UL,_18446744073709551615UL,_2UL>,_Gudhi::layout_right>::
Simple_mdspan<int>(Simple_mdspan<int,_Gudhi::extents<int,_2UL,_18446744073709551615UL,_2UL>,_Gudhi::layout_right>
                   *this,data_handle_type ptr,int exts)

{
  bool bVar1;
  undefined8 *puVar2;
  extents<int,_2UL,_18446744073709551615UL,_2UL> local_2c;
  int local_1c;
  data_handle_type piStack_18;
  int exts_local;
  data_handle_type ptr_local;
  Simple_mdspan<int,_Gudhi::extents<int,_2UL,_18446744073709551615UL,_2UL>,_Gudhi::layout_right>
  *this_local;
  
  this->ptr_ = ptr;
  local_1c = exts;
  piStack_18 = ptr;
  ptr_local = (data_handle_type)this;
  extents<int,_2UL,_18446744073709551615UL,_2UL>::extents<int>(&local_2c,exts);
  layout_right::mapping<Gudhi::extents<int,_2UL,_18446744073709551615UL,_2UL>_>::mapping
            (&this->map_,&local_2c);
  if (piStack_18 == (data_handle_type)0x0) {
    bVar1 = empty(this);
    if (!bVar1) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = "Given pointer is not properly initialized.";
      __cxa_throw(puVar2,&char_const*::typeinfo,0);
    }
  }
  return;
}

Assistant:

explicit Simple_mdspan(data_handle_type ptr, IndexTypes... exts)
      : ptr_(ptr), map_(extents_type(exts...))
  {
    GUDHI_CHECK(ptr != nullptr || empty() || Extents::rank() == 0, "Given pointer is not properly initialized.");
  }